

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

int CVmObjList::getp_count_of(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  char *buf;
  vm_val_t ele;
  vm_val_t local_40;
  
  if (getp_count_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_count_of();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_count_of::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    uVar2 = *(undefined4 *)&self_val->field_0x4;
    aVar1 = self_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = self_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    uVar6 = (ulong)*(ushort *)lst;
    if (uVar6 == 0) {
      vVar5 = 0;
    }
    else {
      buf = lst + 2;
      vVar5 = 0;
      do {
        local_40.typ = (vm_datatype_t)*buf;
        vmb_get_dh_val(buf,&local_40);
        iVar4 = vm_val_t::equals(&local_40,pvVar3 + -1,0);
        vVar5 = (vVar5 + 1) - (uint)(iVar4 == 0);
        buf = buf + 5;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    sp_ = sp_ + -2;
    retval->typ = VM_INT;
    (retval->val).obj = vVar5;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_count_of(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *lst, uint *argc)
{
    vm_val_t *val;
    size_t idx;
    size_t cnt;
    size_t val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to find, but leave it on the stack for gc protection */
    val = G_stk->get(0);

    /* lave the self value on the stack for gc protection */
    G_stk->push(self_val);

    /* get the number of elements in the list */
    cnt = vmb_get_len(lst);

    /* scan the list and count the elements */
    for (idx = 0, val_cnt = 0 ; idx < cnt ; ++idx)
    {
        vm_val_t ele;
        
        /* re-translate the list address in case of swapping */
        VM_IF_SWAPPING_POOL(if (self_val->typ == VM_LIST)
            lst = self_val->get_as_list(vmg0_);)

        /* get this list element */
        vmb_get_dh(get_element_ptr_const(lst, idx), &ele);

        /* if it's the one we're looking for, count it */
        if (ele.equals(vmg_ val))
            ++val_cnt;
    }

    /* discard our gc protection */
    G_stk->discard(2);

    /* return the count */
    retval->set_int(val_cnt);

    /* handled */
    return TRUE;
}